

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O3

void pztopology::TPZLine::MapToSide<double>
               (int side,TPZVec<double> *InternalPar,TPZVec<double> *SidePar,
               TPZFMatrix<double> *JacToSide)

{
  int iVar1;
  TPZTransform<double> Transf;
  TPZTransform<double> TransfR;
  TPZTransform<double> local_360;
  TPZTransform<double> local_1c0;
  
  SideToSideTransform(&local_1c0,2,side);
  TPZTransform<double>::TPZTransform(&local_360);
  TPZTransform<double>::CopyFrom(&local_360,&local_1c0);
  iVar1 = SideDimension(side);
  (*SidePar->_vptr_TPZVec[3])(SidePar,(long)iVar1);
  TPZTransform<double>::Apply(&local_360,InternalPar,SidePar);
  TPZFMatrix<double>::operator=(JacToSide,&local_360.fMult.super_TPZFMatrix<double>);
  TPZTransform<double>::~TPZTransform(&local_360);
  TPZTransform<double>::~TPZTransform(&local_1c0);
  return;
}

Assistant:

void TPZLine::MapToSide(int side, TPZVec<T> &InternalPar, TPZVec<T> &SidePar, TPZFMatrix<T> &JacToSide) {
		TPZTransform<> TransfR = SideToSideTransform(NSides - 1, side);
        TPZTransform<T> Transf;
        Transf.CopyFrom(TransfR);
		SidePar.Resize(SideDimension(side));
		Transf.Apply(InternalPar,SidePar);
		
		JacToSide = Transf.Mult();
	}